

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O3

void __thiscall bal::Formula::add_parameter(Formula *this,string *key,string *name,uint32_t value)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint32_t uVar4;
  string __str;
  string local_50;
  
  cVar3 = '\x01';
  if (9 < value) {
    uVar4 = value;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar4 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0010f53f;
      }
      if (uVar4 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0010f53f;
      }
      if (uVar4 < 10000) goto LAB_0010f53f;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_0010f53f:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,value);
  add_parameter(this,key,name,&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Formula::add_parameter(const std::string& key, const std::string& name, const uint32_t value) {
        add_parameter(key, name, std::to_string(value), false);
    }